

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_dead_code_elimination.cpp
# Opt level: O3

void __thiscall
optimization::complex_dce::ComplexDceRunner::delete_excess_vars(ComplexDceRunner *this)

{
  __node_base_ptr p_Var1;
  _Base_ptr p_Var2;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr __args;
  ulong __code;
  _Base_ptr p_Var3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_68;
  _Rb_tree_node_base *local_50;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_48;
  
  p_Var2 = (this->f->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(this->f->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var2 != local_50) {
    do {
      local_68.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __args = p_Var2[3]._M_parent;
      p_Var3 = p_Var2[3]._M_left;
      if (__args == p_Var3) {
        local_68.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        local_68.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        local_68.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_68.
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      }
      else {
        do {
          __code = (ulong)*(uint *)((long)*(__uniq_ptr_data<mir::inst::Inst,_std::default_delete<mir::inst::Inst>,_true,_true>
                                            *)__args + 0x10);
          p_Var1 = std::
                   _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::_M_find_before_node
                             (&(this->do_not_delete)._M_h,
                              __code % (this->do_not_delete)._M_h._M_bucket_count,
                              (key_type *)
                              ((long)*(__uniq_ptr_data<mir::inst::Inst,_std::default_delete<mir::inst::Inst>,_true,_true>
                                       *)__args + 8),__code);
          if ((p_Var1 == (__node_base_ptr)0x0) || (p_Var1->_M_nxt == (_Hash_node_base *)0x0)) {
            this->it_changed = true;
          }
          else {
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        *)&local_68,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)__args)
            ;
          }
          __args = (_Base_ptr)&__args->_M_parent;
        } while (__args != p_Var3);
        __args = p_Var2[3]._M_parent;
        p_Var3 = p_Var2[3]._M_left;
      }
      local_48.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var2[3]._M_right;
      *(undefined4 *)&p_Var2[3]._M_parent =
           local_68.
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_;
      *(undefined4 *)((long)&p_Var2[3]._M_parent + 4) =
           local_68.
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._4_4_;
      *(undefined4 *)&p_Var2[3]._M_left =
           local_68.
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish._0_4_;
      *(undefined4 *)((long)&p_Var2[3]._M_left + 4) =
           local_68.
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish._4_4_;
      p_Var2[3]._M_right =
           (_Base_ptr)
           local_68.
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)__args;
      local_48.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3;
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector(&local_48);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector(&local_68);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != local_50);
  }
  return;
}

Assistant:

void ComplexDceRunner::delete_excess_vars() {
  for (auto& bb : f.basic_blks) {
    auto new_inst = std::vector<std::unique_ptr<Inst>>();
    for (auto& inst : bb.second.inst) {
      if (do_not_delete.find(inst->dest) != do_not_delete.end()) {
        new_inst.push_back(std::move(inst));
      } else {
        it_changed = true;
      }
    }
    bb.second.inst = std::move(new_inst);
  }
}